

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O1

bool __thiscall Liby::http::ReplyParser::ParseStatus(ReplyParser *this,char *begin,char *end)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  char *__nptr;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  int iVar8;
  bool bVar9;
  char *local_58 [2];
  char local_48 [16];
  char *local_38;
  
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58);
  __nptr = local_58[0];
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(__nptr,&local_38,10);
  if (local_38 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    iVar8 = (int)lVar4;
    if ((iVar8 == lVar4) && (*piVar3 != 0x22)) {
      if (*piVar3 == 0) {
        *piVar3 = iVar1;
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
      p_Var6 = status_number_abi_cxx11_._M_h._M_buckets
               [(ulong)(long)iVar8 % status_number_abi_cxx11_._M_h._M_bucket_count];
      p_Var7 = (__node_base_ptr)0x0;
      if ((p_Var6 != (__node_base_ptr)0x0) &&
         (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(int *)&p_Var6->_M_nxt[1]._M_nxt != iVar8)) {
        while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
          p_Var7 = (__node_base_ptr)0x0;
          if (((ulong)(long)*(int *)&p_Var2[1]._M_nxt %
               status_number_abi_cxx11_._M_h._M_bucket_count !=
               (ulong)(long)iVar8 % status_number_abi_cxx11_._M_h._M_bucket_count) ||
             (p_Var7 = p_Var6, *(int *)&p_Var2[1]._M_nxt == iVar8)) goto LAB_0011b54c;
        }
        p_Var7 = (__node_base_ptr)0x0;
      }
LAB_0011b54c:
      if (p_Var7 == (__node_base_ptr)0x0) {
        bVar9 = true;
      }
      else {
        bVar9 = p_Var7->_M_nxt == (_Hash_node_base *)0x0;
      }
      if (bVar9 == false) {
        this->progress_ = 3;
        (this->super_Reply).status_ = iVar8;
      }
      return (bool)(bVar9 ^ 1);
    }
  }
  uVar5 = std::__throw_out_of_range("stoi");
  if (*piVar3 == 0) {
    *piVar3 = iVar1;
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

bool ReplyParser::ParseStatus(const char *begin, const char *end) {
    int status = std::stoi(std::string(begin, end));
    auto it = status_number.find(status);
    if (it == status_number.end()) {
        return false;
    } else {
        progress_ = ParsingStatusString;
        status_ = status;
        return true;
    }
}